

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

Stack_Holder * __thiscall
chaiscript::detail::Dispatch_Engine::get_stack_holder(Dispatch_Engine *this)

{
  Stack_Holder *pSVar1;
  Dispatch_Engine *this_local;
  
  pSVar1 = threading::Thread_Storage<chaiscript::detail::Stack_Holder>::operator*
                     (&this->m_stack_holder);
  return pSVar1;
}

Assistant:

Stack_Holder &get_stack_holder() noexcept { return *m_stack_holder; }